

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string * __thiscall
google::protobuf::Reflection::GetString_abi_cxx11_
          (string *__return_storage_ptr__,Reflection *this,Message *message,FieldDescriptor *field)

{
  void *pvVar1;
  bool bVar2;
  CppStringType CVar3;
  uint32_t uVar4;
  OneofDescriptor *pOVar5;
  Cord **ppCVar6;
  string *psVar7;
  ArenaStringPtr *pAVar8;
  Cord *this_00;
  char *description;
  Descriptor *pDVar9;
  Metadata MVar10;
  allocator<char> local_31;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  MVar10 = Message::GetMetadata(message);
  if (MVar10.reflection != this) {
    pDVar9 = this->descriptor_;
    MVar10 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar9,MVar10.descriptor,field,"GetString");
  }
  pDVar9 = this->descriptor_;
  if (field->containing_type_ == pDVar9) {
    bVar2 = FieldDescriptor::is_repeated(field);
    if (!bVar2) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"GetString",CPPTYPE_STRING);
      }
      if ((field->field_0x1 & 8) == 0) {
        pOVar5 = FieldDescriptor::real_containing_oneof(field);
        if ((pOVar5 != (OneofDescriptor *)0x0) &&
           (bVar2 = HasOneofField(this,message,field), !bVar2)) {
LAB_00251f3c:
          local_30._M_str = (((field->field_20).default_value_string_)->_M_dataplus)._M_p;
          local_30._M_len = ((field->field_20).default_value_string_)->_M_string_length;
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)__return_storage_ptr__,&local_30,&local_31);
          return __return_storage_ptr__;
        }
        CVar3 = FieldDescriptor::cpp_string_type(field);
        if ((CVar3 != kView) && (CVar3 != kString)) {
          if (CVar3 == kCord) {
            pOVar5 = FieldDescriptor::real_containing_oneof(field);
            if (pOVar5 == (OneofDescriptor *)0x0) {
              this_00 = GetRaw<absl::lts_20250127::Cord>(this,message,field);
            }
            else {
              ppCVar6 = GetRaw<absl::lts_20250127::Cord*>(this,message,field);
              this_00 = *ppCVar6;
            }
            absl::lts_20250127::Cord::operator_cast_to_string(__return_storage_ptr__,this_00);
            return __return_storage_ptr__;
          }
          internal::Unreachable
                    ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0x78b);
        }
        bVar2 = internal::ReflectionSchema::IsFieldInlined(&this->schema_,field);
        if (bVar2) {
          psVar7 = (string *)
                   GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
        }
        else {
          pAVar8 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
          pvVar1 = (pAVar8->tagged_ptr_).ptr_;
          if (((ulong)pvVar1 & 3) == 0) goto LAB_00251f3c;
          psVar7 = (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
        }
      }
      else {
        uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        psVar7 = internal::ExtensionSet::GetString
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                            field->number_,(field->field_20).default_value_string_);
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar7);
      return __return_storage_ptr__;
    }
    pDVar9 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar9,field,"GetString",description);
}

Assistant:

std::string Reflection::GetString(const Message& message,
                                  const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return std::string(field->default_value_string());
    }
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          return std::string(*GetField<absl::Cord*>(message, field));
        } else {
          return std::string(GetField<absl::Cord>(message, field));
        }
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        } else if (IsMicroString(field)) {
          return std::string(GetField<MicroString>(message, field).Get());
        } else {
          const auto& str = GetField<ArenaStringPtr>(message, field);
          return str.IsDefault() ? std::string(field->default_value_string())
                                 : str.Get();
        }
    }
    internal::Unreachable();
  }
}